

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_buildDTable_rle(FSE_DTable *dt,BYTE symbolValue)

{
  *dt = 0;
  *(undefined2 *)(dt + 1) = 0;
  *(BYTE *)((long)dt + 6) = symbolValue;
  *(undefined1 *)((long)dt + 7) = 0;
  return 0;
}

Assistant:

size_t FSE_buildDTable_rle (FSE_DTable* dt, BYTE symbolValue)
{
    void* ptr = dt;
    FSE_DTableHeader* const DTableH = (FSE_DTableHeader*)ptr;
    void* dPtr = dt + 1;
    FSE_decode_t* const cell = (FSE_decode_t*)dPtr;

    DTableH->tableLog = 0;
    DTableH->fastMode = 0;

    cell->newState = 0;
    cell->symbol = symbolValue;
    cell->nbBits = 0;

    return 0;
}